

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmldoc.cpp
# Opt level: O2

void __thiscall libcellml::XmlDoc::parseMathML(XmlDoc *this,string *input)

{
  int iVar1;
  long lVar2;
  xmlDocPtr pxVar3;
  undefined8 uVar4;
  string local_40 [32];
  
  if (parseMathML(std::__cxx11::string_const&)::mathMLDTD_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&parseMathML(std::__cxx11::string_const&)::mathMLDTD_abi_cxx11_);
    if (iVar1 != 0) {
      parseMathML(std::__cxx11::string_const&)::mathMLDTD_abi_cxx11_._M_dataplus._M_p =
           (pointer)&parseMathML(std::__cxx11::string_const&)::mathMLDTD_abi_cxx11_.field_2;
      parseMathML(std::__cxx11::string_const&)::mathMLDTD_abi_cxx11_._M_string_length = 0;
      parseMathML(std::__cxx11::string_const&)::mathMLDTD_abi_cxx11_.field_2._M_local_buf[0] = '\0';
      __cxa_atexit(std::__cxx11::string::~string,
                   &parseMathML(std::__cxx11::string_const&)::mathMLDTD_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&parseMathML(std::__cxx11::string_const&)::mathMLDTD_abi_cxx11_);
    }
  }
  if (parseMathML(std::__cxx11::string_const&)::mathMLDTD_abi_cxx11_._M_string_length == 0) {
    decompressMathMLDTD_abi_cxx11_();
    std::__cxx11::string::operator=
              ((string *)&parseMathML(std::__cxx11::string_const&)::mathMLDTD_abi_cxx11_,local_40);
    std::__cxx11::string::~string(local_40);
  }
  xmlInitParser();
  lVar2 = xmlNewParserCtxt();
  *(XmlDoc **)(lVar2 + 0x1a8) = this;
  xmlSetStructuredErrorFunc(lVar2,structuredErrorCallback);
  pxVar3 = (xmlDocPtr)xmlCtxtReadDoc(lVar2,(input->_M_dataplus)._M_p,"/",0,0);
  this->mPimpl->mXmlDocPtr = pxVar3;
  uVar4 = xmlParserInputBufferCreateMem
                    (parseMathML(std::__cxx11::string_const&)::mathMLDTD_abi_cxx11_._M_dataplus._M_p
                     ,0x5f8a8,0x16);
  uVar4 = xmlIOParseDTD(0,uVar4,0x16);
  xmlValidateDtd(lVar2 + 0xa0,this->mPimpl->mXmlDocPtr,uVar4);
  xmlFreeDtd(uVar4);
  xmlFreeParserCtxt(lVar2);
  xmlSetStructuredErrorFunc(0,0);
  xmlCleanupParser();
  return;
}

Assistant:

void XmlDoc::parseMathML(const std::string &input)
{
    // Decompress the MathML DTD.
    int sizeMathmlDTDUncompressed = MATHML_DTD_LEN;

    static std::string mathMLDTD;

    if (mathMLDTD.empty()) {
        mathMLDTD = decompressMathMLDTD();
    }

    xmlInitParser();
    xmlParserCtxtPtr context = xmlNewParserCtxt();
    context->_private = reinterpret_cast<void *>(this);
    xmlSetStructuredErrorFunc(context, structuredErrorCallback);
    mPimpl->mXmlDocPtr = xmlCtxtReadDoc(context, reinterpret_cast<const xmlChar *>(input.c_str()), "/", nullptr, 0);
    xmlParserInputBufferPtr buf = xmlParserInputBufferCreateMem(reinterpret_cast<const char *>(mathMLDTD.c_str()), sizeMathmlDTDUncompressed, XML_CHAR_ENCODING_ASCII);
    xmlDtdPtr dtd = xmlIOParseDTD(nullptr, buf, XML_CHAR_ENCODING_ASCII);
    xmlValidateDtd(&(context->vctxt), mPimpl->mXmlDocPtr, dtd);

    xmlFreeDtd(dtd);
    xmlFreeParserCtxt(context);
    xmlSetStructuredErrorFunc(nullptr, nullptr);
    xmlCleanupParser();
}